

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O2

bool __thiscall cmGetPropertyCommand::HandleTargetMode(cmGetPropertyCommand *this)

{
  string *name;
  string *__lhs;
  bool bVar1;
  cmTarget *this_00;
  ostream *poVar2;
  cmMessenger *messenger;
  char *value;
  pointer value_00;
  ostringstream e;
  string sStack_1b8;
  
  if ((this->Name)._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffffe68,"not given name for TARGET scope.",
               (allocator<char> *)&sStack_1b8);
    cmCommand::SetError(&this->super_cmCommand,(string *)&stack0xfffffffffffffe68);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
  }
  else {
    name = &this->Name;
    this_00 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,name,false);
    if (this_00 != (cmTarget *)0x0) {
      __lhs = &this->PropertyName;
      bVar1 = std::operator==(__lhs,"ALIASED_TARGET");
      if (bVar1) {
        bVar1 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,name);
        if (bVar1) {
          value_00 = (this_00->Name)._M_dataplus._M_p;
        }
        else {
          value_00 = (char *)0x0;
        }
        StoreResult(this,value_00);
      }
      else {
        cmMakefile::GetBacktrace((cmMakefile *)&stack0xfffffffffffffe68);
        messenger = cmMakefile::GetMessenger((this->super_cmCommand).Makefile);
        bVar1 = cmTargetPropertyComputer::PassesWhitelist
                          (this_00->TargetTypeValue,__lhs,messenger,
                           (cmListFileBacktrace *)&stack0xfffffffffffffe68);
        if (bVar1) {
          value = cmTarget::GetComputedProperty
                            (this_00,__lhs,messenger,(cmListFileBacktrace *)&stack0xfffffffffffffe68
                            );
          if (value == (char *)0x0) {
            value = cmTarget::GetProperty(this_00,__lhs);
          }
        }
        else {
          value = (char *)0x0;
        }
        StoreResult(this,value);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffe70);
      }
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffe68);
    poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe68,"could not find TARGET ");
    poVar2 = std::operator<<(poVar2,(string *)name);
    std::operator<<(poVar2,".  Perhaps it has not yet been created.");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&sStack_1b8);
    std::__cxx11::string::~string((string *)&sStack_1b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffe68);
  }
  return false;
}

Assistant:

bool cmGetPropertyCommand::HandleTargetMode()
{
  if (this->Name.empty()) {
    this->SetError("not given name for TARGET scope.");
    return false;
  }

  if (cmTarget* target = this->Makefile->FindTargetToUse(this->Name)) {
    if (this->PropertyName == "ALIASED_TARGET") {
      if (this->Makefile->IsAlias(this->Name)) {
        return this->StoreResult(target->GetName().c_str());
      }
      return this->StoreResult(nullptr);
    }
    const char* prop_cstr = nullptr;
    cmListFileBacktrace bt = this->Makefile->GetBacktrace();
    cmMessenger* messenger = this->Makefile->GetMessenger();
    if (cmTargetPropertyComputer::PassesWhitelist(
          target->GetType(), this->PropertyName, messenger, bt)) {
      prop_cstr =
        target->GetComputedProperty(this->PropertyName, messenger, bt);
      if (!prop_cstr) {
        prop_cstr = target->GetProperty(this->PropertyName);
      }
    }
    return this->StoreResult(prop_cstr);
  }
  std::ostringstream e;
  e << "could not find TARGET " << this->Name
    << ".  Perhaps it has not yet been created.";
  this->SetError(e.str());
  return false;
}